

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

AssignBlock128
tcu::astc::anon_unknown_0::generateNormalBlock
          (NormalBlockParams *blockParams,int blockWidth,int blockHeight,
          NormalBlockISEInputs *iseInputs)

{
  uint local_68;
  uint local_64;
  uint local_60;
  ISEParams local_58;
  ISEParams *local_50;
  ISEParams *colorEndpointISEParams;
  int colorEndpointDataStartNdx;
  int numBitsForColorEndpoints;
  int numColorEndpointValues;
  int extraCemBitsStart;
  int numWeightBits;
  int numWeights;
  NormalBlockISEInputs *iseInputs_local;
  int blockHeight_local;
  int blockWidth_local;
  NormalBlockParams *blockParams_local;
  AssignBlock128 block;
  
  _numWeightBits = iseInputs;
  iseInputs_local._0_4_ = blockHeight;
  iseInputs_local._4_4_ = blockWidth;
  _blockHeight_local = blockParams;
  AssignBlock128::AssignBlock128((AssignBlock128 *)&blockParams_local);
  extraCemBitsStart = computeNumWeights(_blockHeight_local);
  numColorEndpointValues =
       computeNumRequiredBits(&_blockHeight_local->weightISEParams,extraCemBitsStart);
  writeBlockMode((AssignBlock128 *)&blockParams_local,_blockHeight_local);
  AssignBlock128::setBits
            ((AssignBlock128 *)&blockParams_local,0xb,0xc,_blockHeight_local->numPartitions - 1);
  if (1 < _blockHeight_local->numPartitions) {
    AssignBlock128::setBits
              ((AssignBlock128 *)&blockParams_local,0xd,0x16,_blockHeight_local->partitionSeed);
  }
  if ((_blockHeight_local->numPartitions == 1) ||
     ((_blockHeight_local->isMultiPartSingleCemMode & 1U) != 0)) {
    local_60 = 0xffffffff;
  }
  else {
    if (_blockHeight_local->numPartitions == 4) {
      local_64 = 7;
    }
    else {
      if (_blockHeight_local->numPartitions == 3) {
        local_68 = 4;
      }
      else {
        local_68 = (uint)(_blockHeight_local->numPartitions == 2);
      }
      local_64 = local_68;
    }
    local_60 = local_64;
  }
  numBitsForColorEndpoints = (0x7f - numColorEndpointValues) - local_60;
  writeColorEndpointModes
            ((AssignBlock128 *)&blockParams_local,_blockHeight_local->colorEndpointModes,
             (bool)(_blockHeight_local->isMultiPartSingleCemMode & 1),
             _blockHeight_local->numPartitions,numBitsForColorEndpoints);
  if ((_blockHeight_local->isDualPlane & 1U) != 0) {
    AssignBlock128::setBits
              ((AssignBlock128 *)&blockParams_local,numBitsForColorEndpoints + -2,
               numBitsForColorEndpoints + -1,_blockHeight_local->ccs);
  }
  writeWeightData((AssignBlock128 *)&blockParams_local,&_blockHeight_local->weightISEParams,
                  &_numWeightBits->weight,extraCemBitsStart);
  colorEndpointDataStartNdx =
       computeNumColorEndpointValues
                 (_blockHeight_local->colorEndpointModes,_blockHeight_local->numPartitions,
                  (bool)(_blockHeight_local->isMultiPartSingleCemMode & 1));
  colorEndpointISEParams._4_4_ = computeNumBitsForColorEndpoints(_blockHeight_local);
  colorEndpointISEParams._0_4_ = 0x1d;
  if (_blockHeight_local->numPartitions == 1) {
    colorEndpointISEParams._0_4_ = 0x11;
  }
  local_58 = computeMaximumRangeISEParams(colorEndpointISEParams._4_4_,colorEndpointDataStartNdx);
  local_50 = &local_58;
  writeColorEndpointData
            ((AssignBlock128 *)&blockParams_local,local_50,&_numWeightBits->endpoint,
             colorEndpointDataStartNdx,colorEndpointISEParams._4_4_,(int)colorEndpointISEParams);
  return (AssignBlock128)_blockParams_local;
}

Assistant:

static AssignBlock128 generateNormalBlock (const NormalBlockParams& blockParams, int blockWidth, int blockHeight, const NormalBlockISEInputs& iseInputs)
{
	DE_ASSERT(isValidBlockParams(blockParams, blockWidth, blockHeight));
	DE_UNREF(blockWidth);	// \note For non-debug builds.
	DE_UNREF(blockHeight);	// \note For non-debug builds.

	AssignBlock128	block;
	const int		numWeights		= computeNumWeights(blockParams);
	const int		numWeightBits	= computeNumRequiredBits(blockParams.weightISEParams, numWeights);

	writeBlockMode(block, blockParams);

	block.setBits(11, 12, blockParams.numPartitions - 1);
	if (blockParams.numPartitions > 1)
		block.setBits(13, 22, blockParams.partitionSeed);

	{
		const int extraCemBitsStart = 127 - numWeightBits - (blockParams.numPartitions == 1 || blockParams.isMultiPartSingleCemMode		? -1
															: blockParams.numPartitions == 4											? 7
															: blockParams.numPartitions == 3											? 4
															: blockParams.numPartitions == 2											? 1
															: 0);

		writeColorEndpointModes(block, &blockParams.colorEndpointModes[0], blockParams.isMultiPartSingleCemMode, blockParams.numPartitions, extraCemBitsStart);

		if (blockParams.isDualPlane)
			block.setBits(extraCemBitsStart-2, extraCemBitsStart-1, blockParams.ccs);
	}

	writeWeightData(block, blockParams.weightISEParams, iseInputs.weight, numWeights);

	{
		const int			numColorEndpointValues		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
		const int			numBitsForColorEndpoints	= computeNumBitsForColorEndpoints(blockParams);
		const int			colorEndpointDataStartNdx	= blockParams.numPartitions == 1 ? 17 : 29;
		const ISEParams&	colorEndpointISEParams		= computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues);

		writeColorEndpointData(block, colorEndpointISEParams, iseInputs.endpoint, numColorEndpointValues, numBitsForColorEndpoints, colorEndpointDataStartNdx);
	}

	return block;
}